

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O0

int test(char *url)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  void *__ptr;
  undefined8 uVar5;
  CURL *pCVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  timeval older;
  timeval older_00;
  int local_37c;
  int ec_15;
  int itimeout;
  CURLMcode ec_14;
  CURLMcode ec_13;
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  uint __i;
  CURLMcode ec_12;
  CURLMcode ec_11;
  CURLcode ec_10;
  CURLcode ec_9;
  CURLcode ec_8;
  CURLcode ec_7;
  CURLcode ec_6;
  CURLcode ec_5;
  CURLcode ec_4;
  CURLcode ec_3;
  CURLcode ec_2;
  CURLcode ec_1;
  _Bool found_new_socket;
  long lStack_1f0;
  int maxfd;
  long timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  timeval interval;
  __time_t _Stack_50;
  CURLcode ec;
  __suseconds_t local_48;
  char *full_url;
  size_t urllen;
  HandleState state;
  int num_handles;
  int i;
  int running;
  CURLM *multi;
  char *url_local;
  
  _i = 0;
  urllen._4_4_ = 0;
  urllen._0_4_ = 0;
  multi = (CURLM *)url;
  sVar4 = strlen(url);
  sVar4 = sVar4 + 5;
  __ptr = malloc(sVar4);
  tVar10 = tutil_tvnow();
  _Stack_50 = tVar10.tv_sec;
  tv_test_start.tv_sec = _Stack_50;
  local_48 = tVar10.tv_usec;
  tv_test_start.tv_usec = local_48;
  if (__ptr == (void *)0x0) {
    curl_mfprintf(_stderr,"Not enough memory for full url\n");
    url_local._4_4_ = 0x7e;
  }
  else {
    for (state = ReadyForNewHandle; (int)state < 3; state = state + NeedSocketForNewHandle) {
      easy[(int)state] = (CURL *)0x0;
      sockets[(int)state] = -1;
    }
    iVar2 = curl_global_init(3);
    uVar1 = _stderr;
    if (iVar2 != 0) {
      uVar5 = curl_easy_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                    ,0x6e,iVar2,uVar5);
      res = iVar2;
    }
    if (res == 0) {
      _i = curl_multi_init();
      if (_i == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                      ,0x74);
        res = 0x7b;
      }
      while (res == 0) {
        while( true ) {
          lStack_1f0 = -99;
          ec_1 = ~(CURLE_USE_SSL_FAILED|CURLE_HTTP_POST_ERROR);
          if ((int)urllen == 0) {
            pCVar6 = (CURL *)curl_easy_init();
            easy[urllen._4_4_] = pCVar6;
            if (pCVar6 == (CURL *)0x0) {
              curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x87);
              res = 0x7c;
            }
            if (res != 0) goto LAB_001032f5;
            if (urllen._4_4_ % 3 == 2) {
              curl_msnprintf(__ptr,sVar4,"%s0200",multi);
              iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x6b,8);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar5 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x8b,iVar2,uVar5);
                res = iVar2;
              }
            }
            else {
              curl_msnprintf(__ptr,sVar4,"%s0100",multi);
              iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x6b,1);
              uVar1 = _stderr;
              if (iVar2 != 0) {
                uVar5 = curl_easy_strerror(iVar2);
                curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                              ,0x8f,iVar2,uVar5);
                res = iVar2;
              }
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x4a,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x91,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x2712,__ptr);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x92,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x29,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x93,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x50,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x94,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x2715,"testuser:testpass");
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x95,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x4e2b,callback);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x96,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x2711,easy + urllen._4_4_);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x97,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_easy_setopt(easy[urllen._4_4_],0x2a,1);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_easy_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x98,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            iVar2 = curl_multi_add_handle(_i,easy[urllen._4_4_]);
            uVar1 = _stderr;
            if (iVar2 != 0) {
              uVar5 = curl_multi_strerror(iVar2);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x9a,iVar2,uVar5);
              res = iVar2;
            }
            if (res != 0) goto LAB_001032f5;
            urllen._4_4_ = urllen._4_4_ + 1;
            urllen._0_4_ = 1;
          }
          iVar2 = curl_multi_perform(_i,&num_handles);
          uVar1 = _stderr;
          if (iVar2 == 0) {
            if (num_handles < 0) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0x9f,num_handles);
              res = 0x7a;
            }
          }
          else {
            uVar5 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                          ,0x9f,iVar2,uVar5);
            res = iVar2;
          }
          if (res != 0) goto LAB_001032f5;
          curl_mfprintf(_stderr,"%s:%d running %d state %d\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                        ,0xa2,num_handles,(int)urllen);
          tVar10 = tutil_tvnow();
          older.tv_usec = tv_test_start.tv_usec;
          older.tv_sec = tv_test_start.tv_sec;
          lVar7 = tutil_tvdiff(tVar10,older);
          if (5000 < lVar7) {
            curl_mfprintf(_stderr,
                          "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xa4);
            res = 0x7d;
          }
          if ((res != 0) || ((num_handles == 0 && ((int)urllen == 2)))) goto LAB_001032f5;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            fdwrite.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            fdexcep.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
          }
          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
            fdexcep.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
          }
          iVar2 = curl_multi_fdset(_i,fdwrite.__fds_bits + 0xf,fdexcep.__fds_bits + 0xf,&timeout,
                                   &ec_1);
          uVar1 = _stderr;
          if (iVar2 == 0) {
            if ((int)ec_1 < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                            ,0xad,ec_1);
              res = 0x7a;
            }
          }
          else {
            uVar5 = curl_multi_strerror(iVar2);
            curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xad,iVar2,uVar5);
            res = iVar2;
          }
          if (res != 0) goto LAB_001032f5;
          if ((int)urllen != 1) goto LAB_00103026;
          if (ec_1 == ~CURLE_OK) break;
          curl_mfprintf(_stderr,
                        "Warning: socket did not open immediately for new handle (trying again)\n");
        }
        urllen._0_4_ = 2;
        if (urllen._4_4_ < 3) {
          urllen._0_4_ = 0;
        }
        curl_mfprintf(_stderr,"%s:%d new state %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                      ,0xba,(int)urllen);
LAB_00103026:
        iVar2 = curl_multi_timeout(_i,&stack0xfffffffffffffe10);
        uVar1 = _stderr;
        if (iVar2 == 0) {
          if (lStack_1f0 < -1) {
            curl_mfprintf(_stderr,
                          "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                          ,0xbd,lStack_1f0);
            res = 0x73;
          }
        }
        else {
          uVar5 = curl_multi_strerror(iVar2);
          curl_mfprintf(uVar1,"%s:%d curl_multi_timeout() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                        ,0xbd,iVar2,uVar5);
          res = iVar2;
        }
        if (res != 0) break;
        iVar2 = num_handles;
        curl_mfprintf(_stderr,"%s:%d num_handles %d timeout %ld running %d\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                      ,0xc2,urllen._4_4_,lStack_1f0,num_handles);
        if (lStack_1f0 == -1) {
          fdread.__fds_bits[0xf] = 0;
          if ((num_handles == 0) && (urllen._4_4_ == 3)) break;
        }
        else {
          if (lStack_1f0 < 0x80000000) {
            local_37c = (int)lStack_1f0;
          }
          else {
            local_37c = 0x7fffffff;
          }
          fdread.__fds_bits[0xf] = (__fd_mask)(local_37c / 1000);
        }
        iVar3 = select_wrapper(ec_1 + CURLE_UNSUPPORTED_PROTOCOL,
                               (fd_set *)(fdwrite.__fds_bits + 0xf),
                               (fd_set *)(fdexcep.__fds_bits + 0xf),(fd_set *)&timeout,
                               (timeval *)(fdread.__fds_bits + 0xf));
        if (iVar3 == -1) {
          piVar8 = __errno_location();
          uVar1 = _stderr;
          iVar3 = *piVar8;
          pcVar9 = strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                        ,0xd5,iVar3,pcVar9,iVar2);
          res = 0x79;
        }
        if (res != 0) break;
        tVar10 = tutil_tvnow();
        older_00.tv_usec = tv_test_start.tv_usec;
        older_00.tv_sec = tv_test_start.tv_sec;
        lVar7 = tutil_tvdiff(tVar10,older_00);
        if (5000 < lVar7) {
          curl_mfprintf(_stderr,
                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/nomaster[P]curl/tests/libtest/libntlmconnect.c"
                        ,0xd7);
          res = 0x7d;
        }
      }
LAB_001032f5:
      for (state = ReadyForNewHandle; (int)state < 3; state = state + NeedSocketForNewHandle) {
        curl_mprintf("Data connection %d: %d\n",state,counter[(int)state]);
        curl_multi_remove_handle(_i,easy[(int)state]);
        curl_easy_cleanup(easy[(int)state]);
      }
      curl_multi_cleanup(_i);
      curl_global_cleanup();
      free(__ptr);
      url_local._4_4_ = res;
    }
    else {
      free(__ptr);
      url_local._4_4_ = res;
    }
  }
  return url_local._4_4_;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  size_t urllen = strlen(url) + 4 + 1;
  char *full_url = malloc(urllen);

  start_test_timing();

  if(!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return TEST_ERR_MAJOR_BAD;
  }

  for(i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = CURL_SOCKET_BAD;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    free(full_url);
    return res;
  }

  multi_init(multi);

#ifdef USE_PIPELINING
  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);
  multi_setopt(multi, CURLMOPT_MAX_HOST_CONNECTIONS, 5L);
  multi_setopt(multi, CURLMOPT_MAX_TOTAL_CONNECTIONS, 10L);
#endif

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if(state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if(num_handles % 3 == 2) {
        msnprintf(full_url, urllen, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      }
      else {
        msnprintf(full_url, urllen, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);

    fprintf(stderr, "%s:%d running %d state %d\n",
            __FILE__, __LINE__, running, state);

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    if(state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
      fprintf(stderr, "%s:%d new state %d\n",
              __FILE__, __LINE__, state);
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld running %d\n",
            __FILE__, __LINE__, num_handles, timeout, running);

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = 0;
      interval.tv_usec = 5000;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i = 0; i < MAX_EASY_HANDLES; i++) {
    printf("Data connection %d: %d\n", i, counter[i]);
    curl_multi_remove_handle(multi, easy[i]);
    curl_easy_cleanup(easy[i]);
  }

  curl_multi_cleanup(multi);
  curl_global_cleanup();

  free(full_url);

  return res;
}